

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_chvalid(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int n_val;
  uint uVar10;
  undefined4 *puVar11;
  ulong uVar12;
  bool bVar13;
  int n_ch;
  int test_ret;
  int iVar14;
  int test_ret_2;
  int test_ret_1;
  undefined4 *local_38;
  
  if (quiet == '\0') {
    puts("Testing chvalid : 9 of 9 functions ...");
  }
  uVar10 = 0;
  local_38 = &DAT_00151074;
  iVar14 = 0;
  do {
    if (uVar10 == 3) {
      function_tests = function_tests + 1;
      test_ret_1 = 0;
      for (uVar10 = 0; uVar10 != 3; uVar10 = uVar10 + 1) {
        iVar1 = xmlMemBlocks();
        xmlIsBaseChar(*local_38);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIsBaseChar",(ulong)(uint)(iVar2 - iVar1));
          test_ret_1 = test_ret_1 + 1;
          printf(" %d",(ulong)uVar10);
          putchar(10);
        }
        local_38 = local_38 + 1;
      }
      function_tests = function_tests + 1;
      puVar11 = &DAT_00151074;
      iVar1 = 0;
      for (uVar10 = 0; uVar10 != 3; uVar10 = uVar10 + 1) {
        iVar2 = xmlMemBlocks();
        xmlIsBlank(*puVar11);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIsBlank",(ulong)(uint)(iVar3 - iVar2));
          iVar1 = iVar1 + 1;
          printf(" %d",(ulong)uVar10);
          putchar(10);
        }
        puVar11 = puVar11 + 1;
      }
      function_tests = function_tests + 1;
      puVar11 = &DAT_00151074;
      iVar2 = 0;
      for (uVar10 = 0; uVar10 != 3; uVar10 = uVar10 + 1) {
        iVar3 = xmlMemBlocks();
        xmlIsChar(*puVar11);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIsChar",(ulong)(uint)(iVar4 - iVar3));
          iVar2 = iVar2 + 1;
          printf(" %d",(ulong)uVar10);
          putchar(10);
        }
        puVar11 = puVar11 + 1;
      }
      function_tests = function_tests + 1;
      puVar11 = &DAT_00151074;
      iVar3 = 0;
      for (uVar10 = 0; uVar10 != 3; uVar10 = uVar10 + 1) {
        iVar4 = xmlMemBlocks();
        xmlIsCombining(*puVar11);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIsCombining",(ulong)(uint)(iVar5 - iVar4));
          iVar3 = iVar3 + 1;
          printf(" %d",(ulong)uVar10);
          putchar(10);
        }
        puVar11 = puVar11 + 1;
      }
      function_tests = function_tests + 1;
      puVar11 = &DAT_00151074;
      iVar4 = 0;
      for (uVar10 = 0; uVar10 != 3; uVar10 = uVar10 + 1) {
        iVar5 = xmlMemBlocks();
        xmlIsDigit(*puVar11);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIsDigit",(ulong)(uint)(iVar6 - iVar5));
          iVar4 = iVar4 + 1;
          printf(" %d",(ulong)uVar10);
          putchar(10);
        }
        puVar11 = puVar11 + 1;
      }
      function_tests = function_tests + 1;
      puVar11 = &DAT_00151074;
      iVar5 = 0;
      for (uVar10 = 0; uVar10 != 3; uVar10 = uVar10 + 1) {
        iVar6 = xmlMemBlocks();
        xmlIsExtender(*puVar11);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIsExtender",(ulong)(uint)(iVar7 - iVar6));
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar10);
          putchar(10);
        }
        puVar11 = puVar11 + 1;
      }
      function_tests = function_tests + 1;
      puVar11 = &DAT_00151074;
      iVar6 = 0;
      for (uVar10 = 0; uVar10 != 3; uVar10 = uVar10 + 1) {
        iVar7 = xmlMemBlocks();
        xmlIsIdeographic(*puVar11);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIsIdeographic",(ulong)(uint)(iVar8 - iVar7));
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar10);
          putchar(10);
        }
        puVar11 = puVar11 + 1;
      }
      function_tests = function_tests + 1;
      puVar11 = &DAT_00151074;
      iVar7 = 0;
      for (uVar10 = 0; uVar10 != 3; uVar10 = uVar10 + 1) {
        iVar8 = xmlMemBlocks();
        xmlIsPubidChar(*puVar11);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar9 = xmlMemBlocks();
        if (iVar8 != iVar9) {
          iVar9 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIsPubidChar",(ulong)(uint)(iVar9 - iVar8));
          iVar7 = iVar7 + 1;
          printf(" %d",(ulong)uVar10);
          putchar(10);
        }
        puVar11 = puVar11 + 1;
      }
      function_tests = function_tests + 1;
      uVar10 = test_ret_1 + iVar14 + iVar1 + iVar2 + iVar3 + iVar4 + iVar5 + iVar6 + iVar7;
      if (uVar10 != 0) {
        printf("Module chvalid: %d errors\n",(ulong)uVar10);
      }
      return uVar10;
    }
    bVar13 = true;
    while (bVar13) {
      iVar1 = xmlMemBlocks();
      uVar12 = 0xffffffffffffffff;
      if (uVar10 < 3) {
        uVar12 = (ulong)(uint)(&DAT_00151074)[uVar10];
      }
      xmlCharInRange(uVar12,0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 == iVar2) break;
      iVar2 = xmlMemBlocks();
      bVar13 = false;
      printf("Leak of %d blocks found in xmlCharInRange",(ulong)(uint)(iVar2 - iVar1));
      iVar14 = iVar14 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

static int
test_chvalid(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing chvalid : 9 of 9 functions ...\n");
    test_ret += test_xmlCharInRange();
    test_ret += test_xmlIsBaseChar();
    test_ret += test_xmlIsBlank();
    test_ret += test_xmlIsChar();
    test_ret += test_xmlIsCombining();
    test_ret += test_xmlIsDigit();
    test_ret += test_xmlIsExtender();
    test_ret += test_xmlIsIdeographic();
    test_ret += test_xmlIsPubidChar();

    if (test_ret != 0)
	printf("Module chvalid: %d errors\n", test_ret);
    return(test_ret);
}